

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall Clasp::UncoreMinimize::popPath(UncoreMinimize *this,Solver *s,uint32 dl)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  bool bVar4;
  ulong in_RAX;
  
  uVar1 = this->aTop_;
  if (dl <= uVar1) {
    uVar2 = this->eRoot_;
    in_RAX = (ulong)uVar2;
    if ((uVar2 <= uVar1) && ((s->levels_).root <= uVar1)) {
      if (dl < uVar2) {
        dl = uVar2;
      }
      *this->sum_ = -1;
      this->field_0xef = this->field_0xef | 0x40;
      uVar3 = (s->levels_).root;
      this->aTop_ = dl;
      bVar4 = Solver::popRootLevel(s,uVar3 - dl,(LitVec *)0x0,true);
      return bVar4;
    }
  }
  Potassco::fail(-2,"bool Clasp::UncoreMinimize::popPath(Solver &, uint32)",0x3f8,
                 "dl <= aTop_ && eRoot_ <= aTop_ && s.rootLevel() <= aTop_",
                 "You must not mess with my root level!",0,in_RAX);
}

Assistant:

bool UncoreMinimize::popPath(Solver& s, uint32 dl) {
	POTASSCO_REQUIRE(dl <= aTop_ && eRoot_ <= aTop_ && s.rootLevel() <= aTop_, "You must not mess with my root level!");
	if (dl < eRoot_) { dl = eRoot_; }
	sum_[0] = -1;
	path_   = 1;
	return s.popRootLevel(s.rootLevel() - (aTop_ = dl));
}